

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fImplementationLimitTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::LimitQueryCase<deqp::gles3::Functional::LimitQuery::FloatRange>::iterate
          (LimitQueryCase<deqp::gles3::Functional::LimitQuery::FloatRange> *this)

{
  ostringstream *poVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MessageBuilder *this_00;
  char *description;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  FloatRange value;
  FloatRange local_1d0;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  MessageBuilder local_198;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1d0 = LimitQuery::query<deqp::gles3::Functional::LimitQuery::FloatRange>
                        ((Functions *)CONCAT44(extraout_var_00,iVar5),this->m_limit);
  local_1a8._8_4_ = extraout_XMM0_Dc;
  local_1a8._0_4_ = local_1d0.min;
  local_1a8._4_4_ = local_1d0.max;
  local_1a8._12_4_ = extraout_XMM0_Dd;
  err = (**(code **)(CONCAT44(extraout_var,iVar4) + 0x800))();
  glu::checkError(err,"Query failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fImplementationLimitTests.cpp"
                  ,0xf4);
  local_1b8 = ZEXT416((uint)(this->m_minRequiredValue).max);
  local_1c8 = ZEXT416((uint)(this->m_minRequiredValue).min);
  local_198.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_198.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Reported: ");
  LimitQuery::operator<<((ostream *)poVar1,&local_1d0);
  tcu::MessageBuilder::operator<<(&local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  local_198.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_198.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Minimum required: ");
  LimitQuery::operator<<((ostream *)poVar1,&this->m_minRequiredValue);
  tcu::MessageBuilder::operator<<(&local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  bVar2 = (float)local_1c8._0_4_ < (float)local_1a8._0_4_;
  bVar3 = (float)local_1a8._4_4_ < (float)local_1b8._0_4_;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  if (bVar2 || bVar3) {
    local_198.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_198.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"FAIL: ");
    this_00 = tcu::MessageBuilder::operator<<
                        (&local_198,
                         &LimitQuery::
                          QueryClassTraits<(deqp::gles3::Functional::LimitQuery::QueryClass)1>::
                          s_errorDescription);
    tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    description = "Requirement not satisfied";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(bVar2 || bVar3),
             description);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
		const T					value	= query<T>(m_context.getRenderContext().getFunctions(), m_limit);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Query failed");

		const bool isOk = compare<T>(m_minRequiredValue, value);

		m_testCtx.getLog() << TestLog::Message << "Reported: " << value << TestLog::EndMessage;
		m_testCtx.getLog() << TestLog::Message << "Minimum required: " << m_minRequiredValue << TestLog::EndMessage;

		if (!isOk)
			m_testCtx.getLog() << TestLog::Message << "FAIL: " << QueryClassTraits<(QueryClass)QueryTypeTraits<T>::CLASS>::s_errorDescription << TestLog::EndMessage;

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Requirement not satisfied");
		return STOP;
	}